

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_SLT(Context *ctx)

{
  uint writemask;
  uint uVar1;
  size_t in_R8;
  char src0 [64];
  char src1 [64];
  char code [128];
  char local_118 [64];
  char local_d8 [64];
  char local_98 [128];
  
  writemask = (ctx->dest_arg).writemask;
  uVar1 = (writemask >> 2 & 1) + (writemask & 1) + (uint)((writemask >> 1 & 1) != 0) +
          (uint)((writemask >> 3 & 1) != 0);
  make_GLSL_srcarg_string(ctx,0,writemask,local_118,in_R8);
  make_GLSL_srcarg_string(ctx,1,(ctx->dest_arg).writemask,local_d8,in_R8);
  if (uVar1 == 1) {
    make_GLSL_destarg_assign(ctx,local_98,0x80,"float(%s < %s)",local_118,local_d8);
  }
  else {
    make_GLSL_destarg_assign
              (ctx,local_98,0x80,"vec%d(lessThan(%s, %s))",(ulong)uVar1,local_118,local_d8);
  }
  output_line(ctx,"%s",local_98);
  return;
}

Assistant:

static void emit_GLSL_SLT(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // float(bool) or vec(bvec) results in 0.0 or 1.0, like SLT wants.
    if (vecsize == 1)
        make_GLSL_destarg_assign(ctx, code, sizeof (code), "float(%s < %s)", src0, src1);
    else
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "vec%d(lessThan(%s, %s))",
                                 vecsize, src0, src1);
    } // else
    output_line(ctx, "%s", code);
}